

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

RequestBuilder * __thiscall restincurl::RequestBuilder::SendFile(RequestBuilder *this,string *path)

{
  _Head_base<0UL,_restincurl::Request_*,_false> this_00;
  Options *this_01;
  int iVar1;
  FILE *__stream;
  int *piVar2;
  SystemException *this_02;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  stat st;
  
  if (this->is_built_ == true) {
    __assert_fail("!is_built_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x53a,"RequestBuilder &restincurl::RequestBuilder::SendFile(const std::string &)"
                 );
  }
  if (1 < this->request_type_ - PUT) {
    __assert_fail("CanSendFile()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x53b,"RequestBuilder &restincurl::RequestBuilder::SendFile(const std::string &)"
                 );
  }
  this_00._M_head_impl =
       (this->request_)._M_t.
       super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
       super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
       super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
  if (this_00._M_head_impl == (Request *)0x0) {
    __assert_fail("request_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x540,"RequestBuilder &restincurl::RequestBuilder::SendFile(const std::string &)"
                 );
  }
  Request::OpenSourceFile(this_00._M_head_impl,path);
  memset(&st,0,0x90);
  __stream = (FILE *)Request::GetSourceFp
                               ((this->request_)._M_t.
                                super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
                                .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl);
  iVar1 = fileno(__stream);
  iVar1 = fstat(iVar1,(stat *)&st);
  if (iVar1 == 0) {
    this_01 = (this->options_)._M_t.
              super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>.
              _M_t.
              super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
              .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl;
    local_f8._M_dataplus._M_p._0_4_ = 0x2719;
    local_d8._M_dataplus._M_p =
         (pointer)Request::GetSourceFp
                            ((this->request_)._M_t.
                             super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
                             .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl);
    restincurl::Options::Set<_IO_FILE*>(this_01,(CURLoption *)&local_f8,(_IO_FILE **)&local_d8);
    local_f8._M_dataplus._M_p._0_4_ = 0x75a3;
    local_d8._M_dataplus._M_p = (pointer)st.st_size;
    restincurl::Options::Set<long>
              ((this->options_)._M_t.
               super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
               ._M_t.
               super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
               .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,
               (CURLoption *)&local_f8,(long *)&local_d8);
    this->have_data_out_ = true;
    return this;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  this_02 = (SystemException *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string((string *)&local_f8,"Unable to stat file ",&local_f9);
  std::operator+(&local_d8,&local_f8,path);
  SystemException::SystemException(this_02,&local_d8,iVar1);
  __cxa_throw(this_02,&SystemException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RequestBuilder& SendFile(const std::string& path) {
            assert(!is_built_);
            assert(CanSendFile());
            if (!CanSendFile()) {
                throw Exception{"Invalid curl operation for a file upload"};
            }

            assert(request_);
            request_->OpenSourceFile(path);
            struct stat st = {};
            if(fstat(fileno(request_->GetSourceFp()), &st) != 0) {
                const auto e = errno;
                throw SystemException{std::string{"Unable to stat file "} + path, e};
            }

            // set where to read from (on Windows you need to use READFUNCTION too)
            options_->Set(CURLOPT_READDATA, request_->GetSourceFp());
            options_->Set(CURLOPT_INFILESIZE_LARGE, static_cast<curl_off_t>(st.st_size));
            have_data_out_ = true;
            return *this;
        }